

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkPrepareTwoNtks
              (FILE *pErr,Abc_Ntk_t *pNtk,char **argv,int argc,Abc_Ntk_t **ppNtk1,Abc_Ntk_t **ppNtk2
              ,int *pfDelete1,int *pfDelete2)

{
  char *pcVar1;
  Io_FileType_t IVar2;
  int iVar3;
  FILE *__stream;
  Abc_Ntk_t *pAVar4;
  int util_optind;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  FILE *pFile;
  int fCheck;
  Abc_Ntk_t **ppNtk2_local;
  Abc_Ntk_t **ppNtk1_local;
  int argc_local;
  char **argv_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pErr_local;
  
  *pfDelete1 = 0;
  *pfDelete2 = 0;
  if (argc == 0) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      fprintf((FILE *)pErr,"Empty current network.\n");
      return 0;
    }
    if (pNtk->pSpec == (char *)0x0) {
      fprintf((FILE *)pErr,"The external spec is not given.\n");
      return 0;
    }
    __stream = fopen(pNtk->pSpec,"r");
    if (__stream == (FILE *)0x0) {
      fprintf((FILE *)pErr,"Cannot open the external spec file \"%s\".\n",pNtk->pSpec);
      return 0;
    }
    fclose(__stream);
    pNtk2 = Abc_NtkDup(pNtk);
    pcVar1 = pNtk->pSpec;
    IVar2 = Io_ReadFileType(pNtk->pSpec);
    pNtkTemp = Io_Read(pcVar1,IVar2,1,0);
    if (pNtkTemp == (Abc_Ntk_t *)0x0) {
      return 0;
    }
    *pfDelete1 = 1;
    *pfDelete2 = 1;
  }
  else if (argc == 1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      fprintf((FILE *)pErr,"Empty current network.\n");
      return 0;
    }
    pNtk2 = Abc_NtkDup(pNtk);
    pcVar1 = *argv;
    IVar2 = Io_ReadFileType(*argv);
    pNtkTemp = Io_Read(pcVar1,IVar2,1,0);
    if (pNtkTemp == (Abc_Ntk_t *)0x0) {
      return 0;
    }
    *pfDelete1 = 1;
    *pfDelete2 = 1;
  }
  else {
    if (argc != 2) {
      fprintf((FILE *)pErr,"Wrong number of arguments.\n");
      return 0;
    }
    pcVar1 = *argv;
    IVar2 = Io_ReadFileType(*argv);
    pNtk2 = Io_Read(pcVar1,IVar2,1,0);
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      return 0;
    }
    pcVar1 = argv[1];
    IVar2 = Io_ReadFileType(argv[1]);
    pNtkTemp = Io_Read(pcVar1,IVar2,1,0);
    if (pNtkTemp == (Abc_Ntk_t *)0x0) {
      Abc_NtkDelete(pNtk2);
      return 0;
    }
    *pfDelete1 = 1;
    *pfDelete2 = 1;
  }
  iVar3 = Abc_NtkIsStrash(pNtk2);
  if (iVar3 == 0) {
    pAVar4 = Abc_NtkStrash(pNtk2,0,1,0);
    if (*pfDelete1 != 0) {
      Abc_NtkDelete(pNtk2);
    }
    *pfDelete1 = 1;
    pNtk2 = pAVar4;
  }
  iVar3 = Abc_NtkIsStrash(pNtkTemp);
  if (iVar3 == 0) {
    pAVar4 = Abc_NtkStrash(pNtkTemp,0,1,0);
    if (*pfDelete2 != 0) {
      Abc_NtkDelete(pNtkTemp);
    }
    *pfDelete2 = 1;
    pNtkTemp = pAVar4;
  }
  *ppNtk1 = pNtk2;
  *ppNtk2 = pNtkTemp;
  return 1;
}

Assistant:

int Abc_NtkPrepareTwoNtks( FILE * pErr, Abc_Ntk_t * pNtk, char ** argv, int argc, 
    Abc_Ntk_t ** ppNtk1, Abc_Ntk_t ** ppNtk2, int * pfDelete1, int * pfDelete2 )
{
    int fCheck = 1;
    FILE * pFile;
    Abc_Ntk_t * pNtk1, * pNtk2, * pNtkTemp;
    int util_optind = 0;

    *pfDelete1 = 0;
    *pfDelete2 = 0;
    if ( argc == util_optind ) 
    { // use the spec
        if ( pNtk == NULL )
        {
            fprintf( pErr, "Empty current network.\n" );
            return 0;
        }
        if ( pNtk->pSpec == NULL )
        {
            fprintf( pErr, "The external spec is not given.\n" );
            return 0;
        }
        pFile = fopen( pNtk->pSpec, "r" );
        if ( pFile == NULL )
        {
            fprintf( pErr, "Cannot open the external spec file \"%s\".\n", pNtk->pSpec );
            return 0;
        }
        else
            fclose( pFile );
        pNtk1 = Abc_NtkDup(pNtk);
        pNtk2 = Io_Read( pNtk->pSpec, Io_ReadFileType(pNtk->pSpec), fCheck, 0 );
        if ( pNtk2 == NULL )
            return 0;
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else if ( argc == util_optind + 1 ) 
    {
        if ( pNtk == NULL )
        {
            fprintf( pErr, "Empty current network.\n" );
            return 0;
        }
        pNtk1 = Abc_NtkDup(pNtk);
        pNtk2 = Io_Read( argv[util_optind], Io_ReadFileType(argv[util_optind]), fCheck, 0 );
        if ( pNtk2 == NULL )
            return 0;
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else if ( argc == util_optind + 2 ) 
    {
        pNtk1 = Io_Read( argv[util_optind], Io_ReadFileType(argv[util_optind]), fCheck, 0 );
        if ( pNtk1 == NULL )
            return 0;
        pNtk2 = Io_Read( argv[util_optind+1], Io_ReadFileType(argv[util_optind+1]), fCheck, 0 );
        if ( pNtk2 == NULL )
        {
            Abc_NtkDelete( pNtk1 );
            return 0;
        }
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else
    {
        fprintf( pErr, "Wrong number of arguments.\n" );
        return 0;
    }

    // make sure the networks are strashed
    if ( !Abc_NtkIsStrash(pNtk1) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk1, 0, 1, 0 );
        if ( *pfDelete1 )
            Abc_NtkDelete( pNtk1 );
        pNtk1 = pNtkTemp;
        *pfDelete1 = 1;
    }
    if ( !Abc_NtkIsStrash(pNtk2) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk2, 0, 1, 0 );
        if ( *pfDelete2 )
            Abc_NtkDelete( pNtk2 );
        pNtk2 = pNtkTemp;
        *pfDelete2 = 1;
    }

    *ppNtk1 = pNtk1;
    *ppNtk2 = pNtk2;
    return 1;
}